

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_node_copy_cstr(mpack_node_t node,char *buffer,size_t bufsize)

{
  ulong uVar1;
  char *__src;
  mpack_tree_error_t UNRECOVERED_JUMPTABLE;
  ulong __n;
  mpack_error_t mVar2;
  mpack_tree_t *pmVar3;
  mpack_node_data_t *pmVar4;
  ulong uVar5;
  
  pmVar3 = node.tree;
  pmVar4 = node.data;
  if (pmVar3->error != mpack_ok) {
    *buffer = '\0';
    return;
  }
  if (pmVar4->type != mpack_type_str) goto LAB_00109d29;
  __n = (ulong)pmVar4->len;
  if (bufsize - 1 < __n) {
    *buffer = '\0';
    if (pmVar3->error != mpack_ok) {
      return;
    }
    pmVar3->error = mpack_error_too_big;
    UNRECOVERED_JUMPTABLE = pmVar3->error_fn;
    if (UNRECOVERED_JUMPTABLE == (mpack_tree_error_t)0x0) {
      return;
    }
    mVar2 = mpack_error_too_big;
    goto LAB_00109d4d;
  }
  __src = pmVar3->data + (long)(pmVar4->value).children;
  if (__n == 0) {
LAB_00109d56:
    memcpy(buffer,__src,__n);
    buffer[pmVar4->len] = '\0';
  }
  else {
    if (*__src != '\0') {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (__n == uVar5) break;
        uVar1 = uVar5 + 1;
      } while (__src[uVar5] != '\0');
      if (__n <= uVar5) goto LAB_00109d56;
    }
LAB_00109d29:
    *buffer = '\0';
    if (pmVar3->error == mpack_ok) {
      pmVar3->error = mpack_error_type;
      UNRECOVERED_JUMPTABLE = pmVar3->error_fn;
      if (UNRECOVERED_JUMPTABLE != (mpack_tree_error_t)0x0) {
        mVar2 = mpack_error_type;
LAB_00109d4d:
        (*UNRECOVERED_JUMPTABLE)(pmVar3,mVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void mpack_node_copy_cstr(mpack_node_t node, char* buffer, size_t bufsize) {

    // we can't break here because the error isn't recoverable; we
    // have to add a null-terminator.
    mpack_assert(buffer != NULL, "buffer is NULL");
    mpack_assert(bufsize >= 1, "buffer size is zero; you must have room for at least a null-terminator");

    if (mpack_node_error(node) != mpack_ok) {
        buffer[0] = '\0';
        return;
    }

    if (node.data->type != mpack_type_str) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    if (node.data->len > bufsize - 1) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_too_big);
        return;
    }

    if (!mpack_str_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    buffer[node.data->len] = '\0';
}